

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Voxelizer.cpp
# Opt level: O0

void __thiscall
Voxelizer::CmdVoxelize(Voxelizer *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  Scene *this_00;
  element_type *peVar1;
  element_type *this_01;
  shared_ptr<myvk::CommandBuffer> *in_RDI;
  uint32_t push_constants [1];
  shared_ptr<myvk::DescriptorSet> *in_stack_fffffffffffffe88;
  shared_ptr<myvk::DescriptorSet> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  uint32_t in_stack_fffffffffffffe9c;
  uint32_t in_stack_fffffffffffffea0;
  VkShaderStageFlags in_stack_fffffffffffffea4;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *in_stack_fffffffffffffea8;
  CommandBuffer *in_stack_fffffffffffffeb0;
  CommandBuffer *this_02;
  allocator_type *in_stack_fffffffffffffeb8;
  CommandBuffer *pCVar2;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  VkSubpassContents in_stack_fffffffffffffed4;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *in_stack_fffffffffffffed8;
  Ptr<Framebuffer> *in_stack_fffffffffffffee0;
  Ptr<RenderPass> *in_stack_fffffffffffffee8;
  CommandBuffer *in_stack_fffffffffffffef0;
  uint32_t push_constants_offset;
  shared_ptr<myvk::PipelineLayout> *pipeline_layout;
  undefined1 local_cc [4];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  allocator<std::shared_ptr<myvk::DescriptorSet>_> local_99;
  undefined1 *local_98;
  undefined1 local_90 [40];
  VkCommandBuffer local_68;
  shared_ptr<myvk::PipelineLayout> local_48 [2];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  this_00 = (Scene *)std::
                     __shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x15d314);
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  std::vector<VkClearValue,_std::allocator<VkClearValue>_>::vector
            ((vector<VkClearValue,_std::allocator<VkClearValue>_> *)0x15d36e);
  myvk::CommandBuffer::CmdBeginRenderPass
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  std::vector<VkClearValue,_std::allocator<VkClearValue>_>::~vector
            ((vector<VkClearValue,_std::allocator<VkClearValue>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  peVar1 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15d3b2);
  pipeline_layout = local_48;
  std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::GraphicsPipeline,void>
            ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffffe90,
             (shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffffe88);
  myvk::CommandBuffer::CmdBindPipeline
            ((CommandBuffer *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (Ptr<PipelineBase> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x15d3f3);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15d400);
  local_98 = local_90;
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_98 = local_90 + 0x10;
  this_01 = std::__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x15d44f);
  Scene::GetDescriptorSet(this_01);
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_90._32_8_ = local_90;
  local_68 = (VkCommandBuffer)0x2;
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSet>_> *)0x15d49b);
  __l._M_len._0_4_ = in_stack_fffffffffffffed0;
  __l._M_array = (iterator)in_stack_fffffffffffffec8;
  __l._M_len._4_4_ = in_stack_fffffffffffffed4;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector(in_stack_fffffffffffffec0,__l,in_stack_fffffffffffffeb8);
  std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::GraphicsPipeline,void>
            ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffffe90,
             (shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffffe88);
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15d506);
  myvk::CommandBuffer::CmdBindDescriptorSets
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (Ptr<PipelineBase> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x15d53e);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::~allocator(&local_99);
  pCVar2 = (CommandBuffer *)local_90;
  this_02 = (CommandBuffer *)(local_90 + 0x20);
  do {
    this_02 = (CommandBuffer *)
              &this_02[-1].m_command_pool_ptr.
               super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x15d581);
    push_constants_offset = (uint32_t)((ulong)peVar1 >> 0x20);
  } while (this_02 != pCVar2);
  memset(local_cc,0,4);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15d5b6);
  myvk::CommandBuffer::CmdPushConstants
            (this_02,(Ptr<PipelineLayout> *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90);
  std::__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15d5f0);
  Scene::CmdDraw(this_00,in_RDI,pipeline_layout,push_constants_offset);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15d61e);
  myvk::CommandBuffer::CmdEndRenderPass((CommandBuffer *)0x15d626);
  return;
}

Assistant:

void Voxelizer::CmdVoxelize(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) const {
	command_buffer->CmdBeginRenderPass(m_render_pass, m_framebuffer, {});
	{
		command_buffer->CmdBindPipeline(m_pipeline);
		command_buffer->CmdBindDescriptorSets({m_descriptor_set, m_scene_ptr->GetDescriptorSet()}, m_pipeline, {});

		uint32_t push_constants[] = {0};
		command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, 0, sizeof(uint32_t),
		                                 push_constants);
		m_scene_ptr->CmdDraw(command_buffer, m_pipeline_layout, sizeof(uint32_t));
	}
	command_buffer->CmdEndRenderPass();
}